

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq.c
# Opt level: O3

int aq_add_adu(aq_t *q,adu_t *adu)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  void *__dest;
  dlist_t *pdVar4;
  void *pvVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  dlist_s *pdVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  mp3_frame_t local_5e90;
  unsigned_long uVar16;
  
  if (q == (aq_t *)0x0) {
    __assert_fail("q != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",
                  0x27a,"int aq_add_adu(aq_t *, adu_t *)");
  }
  if (adu == (adu_t *)0x0) {
    __assert_fail("adu != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c"
                  ,0x27b,"int aq_add_adu(aq_t *, adu_t *)");
  }
  aq_enqueue_adu(q,adu);
  pdVar9 = (q->adus).end;
  if (pdVar9 == (dlist_s *)0x0) {
    __assert_fail("dlist != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1df,
                  "void aq_insert_dummy_adus(aq_t *)");
  }
  pvVar5 = pdVar9->data;
  if (pvVar5 == (void *)0x0) {
    __assert_fail("tail != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1e1,
                  "void aq_insert_dummy_adus(aq_t *)");
  }
  if (pdVar9->prev == (dlist_s *)0x0) {
    iVar11 = 0;
  }
  else {
    pvVar1 = pdVar9->prev->data;
    if (pvVar1 == (void *)0x0) {
      __assert_fail("prev != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1e6,
                    "void aq_insert_dummy_adus(aq_t *)");
    }
    iVar11 = (*(int *)((long)pvVar1 + 0x4eb0) + *(int *)((long)pvVar1 + 0x10)) -
             *(int *)((long)pvVar1 + 0x4e80);
  }
  iVar10 = *(int *)((long)pvVar5 + 0x10) - iVar11;
  if (0 < iVar10) {
    do {
      pdVar4 = (q->adus).end;
      if (pdVar4 == (dlist_t *)0x0) {
        __assert_fail("dlist != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1bb,
                      "void aq_insert_dummy_adu(aq_t *, unsigned int)");
      }
      pvVar1 = pdVar4->data;
      if (pvVar1 == (void *)0x0) {
        __assert_fail("tail != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1bd,
                      "void aq_insert_dummy_adu(aq_t *, unsigned int)");
      }
      __dest = malloc(0x5e60);
      if (__dest == (void *)0x0) {
        __assert_fail("dummy != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1c0,
                      "void aq_insert_dummy_adu(aq_t *, unsigned int)");
      }
      memcpy(__dest,pvVar1,0x5e60);
      *(int *)((long)__dest + 0x10) = iVar11;
      lVar8 = 0;
      bVar2 = true;
      do {
        bVar6 = bVar2;
        lVar8 = lVar8 * 0x2728 + 0x18;
        lVar14 = 0;
        bVar2 = true;
        do {
          bVar12 = bVar2;
          lVar14 = lVar14 * 0x1390;
          *(undefined4 *)((long)__dest + lVar14 + 0x14 + lVar8) = 0;
          *(undefined4 *)((long)__dest + lVar14 + 8 + lVar8) = 0;
          *(undefined4 *)((long)__dest + lVar14 + 0x1c + lVar8) = 0;
          *(undefined4 *)((long)__dest + lVar14 + 0x3c + lVar8) = 0;
          *(undefined8 *)((long)__dest + lVar14 + 0x34 + lVar8) = 0;
          lVar14 = 1;
          bVar2 = false;
        } while (bVar12);
        lVar8 = 1;
        bVar2 = false;
      } while (bVar6);
      *(undefined8 *)((long)__dest + 0x4e78) = 0;
      *(undefined8 *)((long)__dest + 0x4e80) = 0;
      pdVar4 = dlist_ins_before(&q->adus,pdVar4,__dest);
      if (pdVar4 == (dlist_t *)0x0) {
        __assert_fail("new != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1d5,
                      "void aq_insert_dummy_adu(aq_t *, unsigned int)");
      }
      iVar10 = iVar10 - *(int *)((long)pvVar5 + 0x4eb0);
      iVar11 = 0;
    } while (0 < iVar10);
  }
  pdVar4 = (q->adus).dlist;
  if (pdVar4 == (dlist_t *)0x0) {
    __assert_fail("dlist != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x255,
                  "int aq_need_adu(aq_t *)");
  }
  pvVar5 = pdVar4->data;
  if (pvVar5 == (void *)0x0) {
    __assert_fail("head != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",599,
                  "int aq_need_adu(aq_t *)");
  }
  iVar11 = 0;
  pdVar9 = pdVar4;
  while( true ) {
    pvVar1 = pdVar9->data;
    if (pvVar1 == (void *)0x0) {
      __assert_fail("adu != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x262,
                    "int aq_need_adu(aq_t *)");
    }
    if (*(int *)((long)pvVar5 + 0x4eb0) <=
        (*(int *)((long)pvVar1 + 0x4e80) + iVar11) - *(int *)((long)pvVar1 + 0x10)) break;
    iVar11 = iVar11 + *(int *)((long)pvVar1 + 0x4eb0);
    pdVar9 = pdVar9->next;
    if (pdVar9 == (dlist_s *)0x0) {
      return 0;
    }
  }
  memcpy(&local_5e90,pvVar5,0x4ec0);
  iVar11 = 0;
  memset(local_5e90.raw,0,4000);
  pdVar9 = pdVar4;
  do {
    if (pdVar9 == (dlist_t *)0x0) {
      __assert_fail("dlist != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x213,
                    "void aq_make_frame(aq_t *)");
    }
    pvVar5 = pdVar9->data;
    if (pvVar5 == (void *)0x0) {
      __assert_fail("adu != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x215,
                    "void aq_make_frame(aq_t *)");
    }
    uVar3 = iVar11 - *(int *)((long)pvVar5 + 0x10);
    if ((long)local_5e90.frame_data_size < (long)(int)uVar3) break;
    uVar16 = *(ulong *)((long)pvVar5 + 0x4e80) + (long)(int)uVar3;
    if ((long)local_5e90.frame_data_size <= (long)uVar16) {
      uVar16 = local_5e90.frame_data_size;
    }
    uVar15 = (uint)uVar16;
    uVar7 = 0;
    if (0 < (int)uVar15) {
      uVar7 = uVar15;
    }
    uVar13 = 0;
    if (0 < (int)uVar3) {
      uVar13 = (ulong)uVar3;
    }
    if (-1 < (int)uVar3) {
      uVar7 = uVar15 - uVar3;
    }
    if (uVar7 != 0) {
      uVar3 = (int)uVar3 >> 0x1f & -uVar3;
      if (*(ulong *)((long)pvVar5 + 0x4e80) < (ulong)(uVar7 + uVar3)) {
        __assert_fail("adu->adu_size >= from_offset + data_length",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x237,
                      "void aq_make_frame(aq_t *)");
      }
      memcpy(local_5e90.raw +
             uVar13 + local_5e90.si_size + (ulong)(local_5e90.protected == '\0') * 2 + 4,
             (void *)((long)pvVar5 +
                     (ulong)uVar3 + 0x4ec4 +
                     *(long *)((long)pvVar5 + 0x4e68) +
                     (ulong)(*(char *)((long)pvVar5 + 2) == '\0') * 2),(ulong)uVar7);
    }
    iVar11 = iVar11 + *(int *)((long)pvVar5 + 0x4eb0);
    pdVar9 = pdVar9->next;
  } while ((long)(int)uVar15 < (long)local_5e90.frame_data_size);
  pvVar5 = dlist_get(&q->adus,pdVar4);
  if (pvVar5 != (void *)0x0) {
    free(pvVar5);
    aq_enqueue_frame(q,&local_5e90);
    return 1;
  }
  __assert_fail("adu != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",
                0xac,"void aq_discard_top_adu(aq_t *)");
}

Assistant:

int aq_add_adu(aq_t *q, adu_t *adu) {
  assert(q != NULL);
  assert(adu != NULL);

  aq_enqueue_adu(q, adu);
  aq_insert_dummy_adus(q);

  if (aq_need_adu(q)) {
    aq_make_frame(q);
    return 1;
  } else {
    return 0;
  }
}